

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O1

_Bool effect_handler_DAMAGE(effect_handler_context_t *context)

{
  trap *ptVar1;
  _Bool _Var2;
  wchar_t wVar3;
  monster *mon;
  monster_conflict *t_mon;
  loc grid;
  char *pcVar4;
  char killer [80];
  char acStack_78 [88];
  
  wVar3 = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  context->ident = true;
  switch((context->origin).what) {
  case SRC_NONE:
    pcVar4 = "a bug";
    goto LAB_00139d69;
  case SRC_TRAP:
    ptVar1 = (context->origin).which.trap;
    _Var2 = is_a_vowel((int)*ptVar1->kind->desc);
    pcVar4 = "a ";
    if (_Var2) {
      pcVar4 = "an ";
    }
    strnfmt(acStack_78,0x50,"%s%s",pcVar4,ptVar1->kind->desc);
    break;
  case SRC_PLAYER:
    pcVar4 = context->msg;
    if (pcVar4 == (char *)0x0) {
      pcVar4 = "yourself";
    }
LAB_00139d69:
    my_strcpy(acStack_78,pcVar4,0x50);
    break;
  case SRC_MONSTER:
    mon = cave_monster(cave,(context->origin).which.monster);
    t_mon = (monster_conflict *)monster_target_monster((effect_handler_context_t_conflict *)context)
    ;
    grid = cave_find_decoy(cave);
    if (t_mon != (monster_conflict *)0x0) {
      mon_take_nonplayer_hit(wVar3,t_mon,MON_MSG_NONE,MON_MSG_DIE);
      return true;
    }
    if (grid.x != L'\0' && (ulong)grid >> 0x20 != 0) {
      square_destroy_decoy(cave,grid);
      return true;
    }
    monster_desc(acStack_78,0x50,mon,L'\x88');
    break;
  case SRC_OBJECT:
    object_desc(acStack_78,0x50,(context->origin).which.object,0x40,player);
    break;
  case SRC_CHEST_TRAP:
    strnfmt(acStack_78,0x50,"%s",((context->origin).which.chest_trap)->msg_death);
  }
  wVar3 = player_apply_damage_reduction(player,wVar3);
  if ((wVar3 != L'\0') && ((player->opts).opt[3] == true)) {
    msg("You take %d damage.",(ulong)(uint)wVar3);
  }
  take_hit(player,wVar3,acStack_78);
  return true;
}

Assistant:

bool effect_handler_DAMAGE(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, false);
	char killer[80];

	/* Always ID */
	context->ident = true;

	switch (context->origin.what) {
		case SRC_MONSTER: {
			struct monster *mon = cave_monster(cave,
											   context->origin.which.monster);
			struct monster *t_mon = monster_target_monster(context);
			struct loc decoy = cave_find_decoy(cave);

			/* Damage another monster */
			if (t_mon) {
				bool fear = false;

				mon_take_nonplayer_hit(dam, t_mon, MON_MSG_NONE, MON_MSG_DIE);
				if (fear && monster_is_visible(t_mon)) {
					add_monster_message(t_mon, MON_MSG_FLEE_IN_TERROR, true);
				}
				return true;
			}

			/* Destroy a decoy */
			if (decoy.y && decoy.x) {
				square_destroy_decoy(cave, decoy);
				return true;
			}

			monster_desc(killer, sizeof(killer), mon, MDESC_DIED_FROM);
			break;
		}

		case SRC_TRAP: {
			struct trap *trap = context->origin.which.trap;
			const char *article = is_a_vowel(trap->kind->desc[0]) ? "an " : "a ";
			strnfmt(killer, sizeof(killer), "%s%s", article, trap->kind->desc);
			break;
		}

		case SRC_OBJECT: {
			/* Must be a cursed weapon */
			struct object *obj = context->origin.which.object;
			object_desc(killer, sizeof(killer), obj,
				ODESC_PREFIX | ODESC_BASE, player);
			break;
		}

		case SRC_CHEST_TRAP: {
			struct chest_trap *trap = context->origin.which.chest_trap;
			strnfmt(killer, sizeof(killer), "%s", trap->msg_death);
			break;
		}

		case SRC_PLAYER: {
			if (context->msg) {
				my_strcpy(killer, context->msg, sizeof(killer));
			} else {
				my_strcpy(killer, "yourself", sizeof(killer));
			}
			break;
		}

		case SRC_NONE: {
			my_strcpy(killer, "a bug", sizeof(killer));
			break;
		}
	}

	/* Hit the player */
	dam = player_apply_damage_reduction(player, dam);
	if (dam && OPT(player, show_damage)) {
		msg("You take %d damage.", dam);
	}
	take_hit(player, dam, killer);

	return true;
}